

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.h
# Opt level: O2

bool __thiscall ami_nvar_t::nvar_entry_body_t::_is_null_guid(nvar_entry_body_t *this)

{
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,(string *)&this->m_guid);
  std::__cxx11::string::~string(local_30);
  return this->n_guid;
}

Assistant:

bool _is_null_guid() { guid(); return n_guid; }